

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmSourceFile * __thiscall
cmMakefile::CreateSource(cmMakefile *this,string *sourceName,bool generated)

{
  pointer *pppcVar1;
  iterator __position;
  cmSourceFile *this_00;
  cmSourceFile *sf;
  cmSourceFile *local_48;
  string local_40;
  
  this_00 = (cmSourceFile *)operator_new(0x128);
  cmSourceFile::cmSourceFile(this_00,this,sourceName);
  local_48 = this_00;
  if (generated) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GENERATED","");
    cmSourceFile::SetProperty(this_00,&local_40,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  __position._M_current =
       (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::_M_realloc_insert<cmSourceFile*const&>
              ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceFiles,__position,
               &local_48);
  }
  else {
    *__position._M_current = this_00;
    pppcVar1 = &(this->SourceFiles).
                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
    local_48 = this_00;
  }
  return local_48;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated)
{
  cmSourceFile* sf = new cmSourceFile(this, sourceName);
  if(generated)
    {
    sf->SetProperty("GENERATED", "1");
    }
  this->SourceFiles.push_back(sf);
  return sf;
}